

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  byte bVar1;
  unsigned_long srcSize;
  unsigned_long srcSize_00;
  void *__n;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  FILE *__stream;
  size_type __n_00;
  size_t sVar6;
  int *piVar7;
  float ***pppfVar8;
  float **ppfVar9;
  int **ppiVar10;
  float *pfVar11;
  size_t sVar12;
  char **ppcVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uchar *src;
  ulong uVar19;
  uint uVar20;
  float fVar21;
  long lVar22;
  int iVar23;
  undefined8 uVar24;
  int c;
  ulong uVar25;
  pointer paVar26;
  int c_1;
  ulong uVar27;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<float,_std::allocator<float>_> image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<int,_std::allocator<int>_> channelOffsetList;
  vector<char,_std::allocator<char>_> buf;
  int *local_160;
  int local_158;
  uint local_14c;
  vector<int,_std::allocator<int>_> local_148;
  allocator_type local_129;
  ulong local_128;
  ulong local_120;
  string local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  size_type local_e0;
  size_t local_d8;
  uint local_cc;
  pointer local_c8;
  string local_c0;
  int *local_a0;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_98;
  void *local_80 [2];
  long local_70;
  size_t local_68;
  long local_60;
  int *local_58;
  ulong local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar14 = "Invalid argument.";
LAB_0019a059:
    *err = pcVar14;
    return -1;
  }
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar14 = "Cannot read file.";
    goto LAB_0019a059;
  }
  fseek(__stream,0,2);
  __n_00 = ftell(__stream);
  fseek(__stream,0,0);
  if (__n_00 == 0) {
    fclose(__stream);
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar14 = "File size is zero.";
    goto LAB_0019a059;
  }
  std::vector<char,_std::allocator<char>_>::vector(&local_48,__n_00,(allocator_type *)&local_118);
  sVar6 = fread(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start,1,__n_00,__stream);
  if (sVar6 != __n_00) {
    __assert_fail("ret == filesize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x27eb,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
  }
  fclose(__stream);
  if (*(int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == 0x1312f76) {
    if (((((char)*(int *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start + 4) != '\x02') ||
         (*(char *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start + 5) != '\b')) ||
        (*(char *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start + 6) != '\0')) ||
       (*(char *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + 7) != '\0')) {
      iVar23 = -4;
      if (err != (char **)0x0) {
        *err = "Unsupported version or scanline.";
      }
      goto LAB_0019a08a;
    }
    local_a0 = (int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
    local_160 = (int *)((long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start + 8);
    local_98.
    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar23 = -3;
    local_158 = 1;
    local_128 = 0xffffffff;
    local_120 = 0xffffffff;
    local_e0 = CONCAT44(local_e0._4_4_,0xffffffff);
    local_d8 = CONCAT44(local_d8._4_4_,0xffffffff);
    local_14c = 0xffffffff;
    local_c8 = (pointer)CONCAT44(local_c8._4_4_,0xffffffff);
    do {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      uVar24 = 0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      piVar7 = (int *)anon_unknown.dwarf_18040f::ReadAttribute
                                (&local_118,&local_c0,
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148
                                 ,(char *)local_160);
      if (piVar7 == (int *)0x0) {
        local_160 = (int *)((long)local_160 + 1);
        iVar4 = 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar4 == 0) {
          bVar1 = *(byte *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data
                            ._M_start;
          if (bVar1 < 4) {
            if (bVar1 == 3) {
              local_158 = 0x10;
            }
            local_c8 = (pointer)CONCAT44(local_c8._4_4_,(uint)bVar1);
LAB_0019a302:
            iVar4 = 0;
            local_160 = piVar7;
          }
          else {
            iVar23 = -5;
            iVar4 = 1;
            if (err != (char **)0x0) {
              pcVar14 = "Unsupported compression type.";
LAB_0019a287:
              iVar4 = 1;
              *err = pcVar14;
            }
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_118);
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::string::compare((char *)&local_118);
            if (iVar4 == 0) {
              uVar15 = (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                if (uVar15 < 5) {
                  uVar24 = 4;
                }
                else if (uVar15 < 9) {
                  uVar24 = 8;
                }
                else {
                  if (0xc < uVar15) {
                    local_d8 = CONCAT44(local_d8._4_4_,
                                        *(undefined4 *)
                                         &(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                             *)local_148.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start)->_M_impl).
                                          super__Vector_impl_data._M_start);
                    local_e0 = CONCAT44(local_e0._4_4_,
                                        *(undefined4 *)
                                         ((long)&(((
                                                  _Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  *)local_148.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start)->
                                                 _M_impl).super__Vector_impl_data._M_start + 4));
                    local_120 = (ulong)*(uint *)&(((
                                                  _Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  *)local_148.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start)->
                                                 _M_impl).super__Vector_impl_data._M_finish;
                    local_128 = (ulong)*(uint *)((long)&(((
                                                  _Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  *)local_148.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start)->
                                                  _M_impl).super__Vector_impl_data._M_finish + 4);
                    goto LAB_0019a302;
                  }
                  uVar24 = 0xc;
                }
              }
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar24);
LAB_0019ab24:
              uVar24 = 4;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_118);
              if (iVar4 != 0) {
                iVar4 = 0;
                local_160 = piVar7;
                goto LAB_0019a30c;
              }
              uVar15 = (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                if (uVar15 < 5) goto LAB_0019ab24;
                iVar4 = 0;
                if (uVar15 < 9) {
                  uVar24 = 8;
                }
                else {
                  local_160 = piVar7;
                  if (0xc < uVar15) goto LAB_0019a30c;
                  uVar24 = 0xc;
                }
              }
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar24);
            goto LAB_0019ab43;
          }
          anon_unknown.dwarf_18040f::ReadChannelInfo
                    ((anon_unknown_dwarf_18040f *)&local_98,
                     (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          local_14c = (int)((ulong)((long)local_98.
                                          super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_98.
                                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                      -0x55555555;
          if (0 < (int)local_14c) goto LAB_0019a302;
          iVar23 = -6;
          iVar4 = 1;
          if (err != (char **)0x0) {
            pcVar14 = "Invalid channels format.";
            goto LAB_0019a287;
          }
        }
      }
LAB_0019a30c:
      if ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
           *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start !=
          (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
           *)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
    } while (iVar4 == 0);
    if (iVar4 == 2) {
      if ((int)local_d8 < 0) {
LAB_0019ab43:
        __assert_fail("dx >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x2865,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
      }
      if ((int)local_e0 < 0) {
        __assert_fail("dy >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x2866,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
      }
      if ((int)local_120 < 0) {
        __assert_fail("dw >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x2867,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
      }
      iVar23 = (int)local_128;
      if (iVar23 < 0) {
        __assert_fail("dh >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x2868,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
      }
      if ((int)local_14c < 1) {
        __assert_fail("numChannels >= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x2869,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
      }
      uVar5 = (int)local_120 - (int)local_d8;
      local_120 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      local_128 = (ulong)uVar5;
      iVar23 = iVar23 - (int)local_e0;
      uVar20 = iVar23 + 1;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_118,(long)(int)(uVar20 * uVar5 * 4)
                 ,(allocator_type *)&local_c0);
      uVar5 = (uint)(local_158 * ((int)uVar20 / local_158) <= iVar23) + (int)uVar20 / local_158;
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)&local_c0,(long)(int)uVar5,
                 (allocator_type *)&local_148);
      if (0 < (int)uVar5) {
        uVar15 = 0;
        do {
          *(undefined8 *)(local_c0._M_dataplus._M_p + uVar15 * 8) =
               *(undefined8 *)(local_160 + uVar15 * 2);
          uVar15 = uVar15 + 1;
        } while (uVar5 != uVar15);
      }
      if (((uint)local_c8 < 4) && ((uint)local_c8 != 1)) {
        uVar15 = (ulong)local_14c;
        local_68 = uVar15 * 8;
        local_50 = (ulong)uVar5;
        pppfVar8 = (float ***)malloc(local_68);
        deepImage->image = pppfVar8;
        uVar25 = 0;
        local_cc = uVar20;
        do {
          ppfVar9 = (float **)malloc((long)(int)uVar20 << 3);
          deepImage->image[uVar25] = ppfVar9;
          uVar25 = uVar25 + 1;
        } while (uVar15 != uVar25);
        ppiVar10 = (int **)malloc((long)(int)uVar20 << 3);
        deepImage->offset_table = ppiVar10;
        local_e0 = (size_type)(int)local_128;
        if (-1 < iVar23) {
          sVar6 = local_e0 * 4;
          uVar25 = (ulong)local_cc;
          uVar27 = 0;
          do {
            piVar7 = (int *)malloc(sVar6);
            deepImage->offset_table[uVar27] = piVar7;
            uVar27 = uVar27 + 1;
          } while (uVar25 != uVar27);
        }
        uVar25 = local_128;
        if (0 < (int)uVar5) {
          local_60 = (long)(int)local_120;
          local_c8 = local_98.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          local_58 = &(local_98.
                       super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->pixelType;
          uVar27 = 0;
          do {
            lVar16 = *(long *)(local_c0._M_dataplus._M_p + uVar27 * 8);
            srcSize = *(unsigned_long *)((long)local_a0 + lVar16 + 4);
            srcSize_00 = *(unsigned_long *)((long)local_a0 + lVar16 + 0xc);
            __n = *(void **)((long)local_a0 + lVar16 + 0x14);
            std::vector<int,_std::allocator<int>_>::vector
                      (&local_148,local_e0,(allocator_type *)&local_f8);
            local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
            if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start == (uchar *)0x0) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
LAB_0019aa8e:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
LAB_0019aaa0:
              __assert_fail("dstLen == (unsigned long)unpackedSampleDataSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28c5,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            src = (uchar *)((long)local_a0 + lVar16 + 0x1c);
            anon_unknown.dwarf_18040f::DecompressZip
                      ((uchar *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,(unsigned_long *)&local_f8,src,
                       srcSize);
            if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (uchar *)((long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start)) {
              __assert_fail("dstLen == pixelOffsetTable.size() * sizeof(int)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28b7,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            if (-1 < (int)local_120) {
              piVar7 = deepImage->offset_table[uVar27];
              uVar18 = 0;
              do {
                piVar7[uVar18] =
                     *(int *)((long)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                        *)local_148.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                     super__Vector_impl_data._M_start + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar25 != uVar18);
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_f8,(size_type)__n,(allocator_type *)local_80);
            local_80[0] = __n;
            if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start) goto LAB_0019aa8e;
            anon_unknown.dwarf_18040f::DecompressZip
                      (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,(unsigned_long *)local_80,
                       src + srcSize,srcSize_00);
            if (local_80[0] != __n) goto LAB_0019aaa0;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_80,uVar15,&local_129);
            uVar25 = 0;
            uVar18 = 0;
            piVar7 = local_58;
            do {
              *(int *)((long)local_80[0] + uVar25 * 4) = (int)uVar18;
              if (2 < (ulong)(uint)*piVar7) {
LAB_0019aa3c:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                              ,0x28d6,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              uVar18 = (long)(int)uVar18 + (long)*(int *)(&DAT_001e60f8 + (ulong)(uint)*piVar7 * 4);
              uVar25 = uVar25 + 1;
              piVar7 = piVar7 + 0xc;
            } while (uVar15 != uVar25);
            uVar25 = (long)*(int *)((long)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              *)local_148.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                           super__Vector_impl_data._M_start + local_60 * 4) * uVar18
            ;
            if ((long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != uVar25) {
              __assert_fail("(size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size()"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x28dd,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
            }
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar18 & 0xffffffff;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar25;
            lVar16 = SUB168(auVar3 / auVar2,0) << 0x20;
            sVar6 = lVar16 >> 0x1e;
            local_d8 = lVar16 >> 0x1f;
            iVar23 = SUB164(auVar3 / auVar2,0);
            lVar16 = (long)iVar23;
            uVar18 = 0;
            uVar25 = 0;
            do {
              pfVar11 = (float *)malloc(sVar6);
              deepImage->image[uVar18][uVar27] = pfVar11;
              sVar12 = sVar6;
              if (local_c8[uVar18].pixelType == 0) {
                if (0 < iVar23) {
                  lVar17 = 0;
                  lVar22 = 0;
                  do {
                    if ((ulong)((long)local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) <= lVar17 + uVar25)
                    goto LAB_0019aa2e;
                    *(float *)((long)deepImage->image[uVar18][uVar27] + lVar17) =
                         (float)*(uint *)(local_f8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                         lVar17 + uVar25);
                    lVar22 = lVar22 + 1;
                    lVar17 = lVar17 + 4;
                  } while (lVar22 < lVar16);
                }
              }
              else if (local_c8[uVar18].pixelType == 1) {
                sVar12 = local_d8;
                if (0 < iVar23) {
                  lVar17 = 0;
                  lVar22 = 0;
                  uVar19 = uVar25;
                  do {
                    if ((ulong)((long)local_f8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) <= uVar19) {
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_0019aa20:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_0019aa2e:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
                      goto LAB_0019aa3c;
                    }
                    uVar20 = (uint)*(ushort *)
                                    (local_f8.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar19) << 0xd;
                    if ((uVar20 & 0xf800000) == 0xf800000) {
                      fVar21 = (float)(uVar20 | 0x70000000);
                    }
                    else if ((uVar20 & 0xf800000) == 0) {
                      fVar21 = (float)(uVar20 | 0x38800000) + -6.1035156e-05;
                    }
                    else {
                      fVar21 = (float)((uVar20 & 0xfffe000) + 0x38000000);
                    }
                    *(uint *)((long)deepImage->image[uVar18][uVar27] + lVar17) =
                         (int)(short)*(ushort *)
                                      (local_f8.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar19) &
                         0x80000000U | (uint)fVar21;
                    lVar22 = lVar22 + 1;
                    lVar17 = lVar17 + 4;
                    uVar19 = uVar19 + 2;
                  } while (lVar22 < lVar16);
                }
              }
              else if (0 < iVar23) {
                lVar17 = 0;
                lVar22 = 0;
                do {
                  if ((ulong)((long)local_f8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) <= lVar17 + uVar25)
                  goto LAB_0019aa20;
                  *(undefined4 *)((long)deepImage->image[uVar18][uVar27] + lVar17) =
                       *(undefined4 *)
                        (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar17 + uVar25);
                  lVar22 = lVar22 + 1;
                  lVar17 = lVar17 + 4;
                } while (lVar22 < lVar16);
              }
              uVar25 = uVar25 + sVar12;
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar15);
            if (local_80[0] != (void *)0x0) {
              operator_delete(local_80[0],local_70 - (long)local_80[0]);
            }
            uVar25 = local_128;
            if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (uchar *)0x0) {
              operator_delete(local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_f8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_f8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 *)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 *)0x0) {
              operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != local_50);
        }
        deepImage->width = (int)uVar25;
        deepImage->height = local_cc;
        ppcVar13 = (char **)malloc(local_68);
        deepImage->channel_names = ppcVar13;
        uVar25 = 0;
        paVar26 = local_98.
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar14 = strdup((paVar26->name)._M_dataplus._M_p);
          deepImage->channel_names[uVar25] = pcVar14;
          uVar25 = uVar25 + 1;
          paVar26 = paVar26 + 1;
        } while (uVar15 != uVar25);
        deepImage->num_channels = local_14c;
        iVar23 = 0;
      }
      else {
        iVar23 = -10;
        if (err != (char **)0x0) {
          *err = "Unsupported format.";
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) - (long)local_c0._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) -
                        (long)local_118._M_dataplus._M_p);
      }
    }
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector(&local_98);
  }
  else {
    iVar23 = -3;
    if (err != (char **)0x0) {
      *err = "Header mismatch.";
    }
  }
  if ((int *)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start == (int *)0x0) {
    return iVar23;
  }
LAB_0019a08a:
  operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return iVar23;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}